

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O3

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode
          (JsBuiltInEngineInterfaceExtensionObject *this,ScriptContext *scriptContext,
          JsBuiltInFile_conflict file)

{
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  JavascriptLibrary *pJVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  uint sourceContextId;
  undefined4 *puVar8;
  ScriptFunction *this_00;
  ParseableFunctionInfo *proxy;
  JsBuiltInEngineInterfaceExtensionObject *this_01;
  FunctionProxy *pFVar9;
  FunctionInfo *pFVar10;
  SRCINFO *srcInfo;
  uint32 scriptFlags;
  undefined1 *buffer;
  FunctionBody *this_02;
  Type *function;
  Arguments local_88;
  Arguments local_78;
  RecyclableObject *local_68;
  Var args [2];
  AutoInitLibraryCodeScope autoInitLibraryCodeScope;
  
  if (file == Array_prototype) {
    if ((this->jsBuiltInArray_prototypeBytecode).ptr != (FunctionBody *)0x0) {
      return;
    }
    function = &this->jsBuiltInArray_prototypeBytecode;
    EnsureSourceInfo(this);
    scriptFlags = (DAT_015933a0 | 8) << 0x10;
    srcInfo = (this->sourceInfo).ptr;
    buffer = js::Library_Bytecode_Array_prototype;
LAB_00d2baa5:
    ByteCodeSerializer::DeserializeFromBuffer
              (scriptContext,scriptFlags,(LPCUTF8)0x0,srcInfo,buffer,(NativeModule *)0x0,function,
               0xffffffff);
    this_02 = function->ptr;
    (this->super_EngineExtensionObjectBase).hasBytecode = true;
    if (this_02 == (FunctionBody *)0x0) goto LAB_00d2bad4;
  }
  else {
    if (file == Math_object) {
      if ((this->jsBuiltInMath_objectBytecode).ptr != (FunctionBody *)0x0) {
        return;
      }
      function = &this->jsBuiltInMath_objectBytecode;
      EnsureSourceInfo(this);
      scriptFlags = (DAT_015933a0 | 8) << 0x10;
      srcInfo = (this->sourceInfo).ptr;
      buffer = js::Library_Bytecode_Math_object;
      goto LAB_00d2baa5;
    }
    if (file == Object_constructor) {
      if ((this->jsBuiltInObject_constructorBytecode).ptr != (FunctionBody *)0x0) {
        return;
      }
      function = &this->jsBuiltInObject_constructorBytecode;
      EnsureSourceInfo(this);
      scriptFlags = (DAT_015933a0 | 8) << 0x10;
      srcInfo = (this->sourceInfo).ptr;
      buffer = js::Library_Bytecode_Object_constructor;
      goto LAB_00d2baa5;
    }
    (this->super_EngineExtensionObjectBase).hasBytecode = true;
LAB_00d2bad4:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x68,"(jsBuiltInByteCode != nullptr)",
                                "jsBuiltInByteCode != nullptr");
    if (!bVar6) goto LAB_00d2bd51;
    *puVar8 = 0;
    this_02 = (FunctionBody *)0x0;
  }
  this_00 = JavascriptLibrary::CreateScriptFunction
                      ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                       (FunctionProxy *)this_02);
  (*(this_00->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x4b])(this_00);
  args[1] = scriptContext;
  ScriptContext::IsDebuggerRecording(scriptContext);
  *(undefined1 *)(*(long *)((long)args[1] + 0x3b8) + 0x1533) = 0;
  ScriptContext::SetIsDebuggerRecording((ScriptContext *)args[1],false);
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  local_68 = (pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
  args[0] = (pJVar3->super_JavascriptLibraryBase).engineInterfaceObject.ptr;
  pTVar4 = scriptContext->threadContext;
  bVar6 = pTVar4->noJsReentrancy;
  pTVar4->noJsReentrancy = false;
  this->current = file;
  DVar1 = pTVar4->disableImplicitFlags;
  IVar2 = pTVar4->implicitCallFlags;
  pTVar4->disableImplicitFlags = DisableImplicitNoFlag;
  local_88.Info = (Type)0x2000002;
  local_88.Values = &local_68;
  JavascriptFunction::CallRootFunctionInScript((JavascriptFunction *)this_00,&local_88);
  pJVar3 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  proxy = ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&this_02->super_ParseableFunctionInfo,0);
  this_01 = (JsBuiltInEngineInterfaceExtensionObject *)
            JavascriptLibrary::CreateScriptFunction(pJVar3,&proxy->super_FunctionProxy);
  (*(((ScriptFunctionBase *)&this_01->super_EngineExtensionObjectBase)->super_JavascriptFunction).
    super_DynamicObject.super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x4b])
            (this_01,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).nullValue.ptr);
  local_78.Info = (Type)0x2000002;
  local_78.Values = &local_68;
  JavascriptFunction::CallRootFunctionInScript((JavascriptFunction *)this_01,&local_78);
  pTVar4->implicitCallFlags = IVar2;
  pTVar4->disableImplicitFlags = DVar1;
  if (file == Array_prototype) {
    InitializePrototypes(this_01,scriptContext);
  }
  pFVar9 = ScriptFunction::GetFunctionProxy(this_00);
  sourceContextId = FunctionProxy::GetSourceContextId(pFVar9);
  pFVar9 = ScriptFunction::GetFunctionProxy(this_00);
  pFVar10 = (pFVar9->functionInfo).ptr;
  if (pFVar10 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar7) {
LAB_00d2bd51:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
    pFVar10 = (pFVar9->functionInfo).ptr;
  }
  bVar7 = Phases::IsEnabled((Phases *)&DAT_015962f8,ByteCodePhase,sourceContextId,
                            pFVar10->functionId);
  if ((bVar7) && (DAT_015bc46a == '\x01')) {
    (*(this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase[1])();
  }
  pTVar4->noJsReentrancy = bVar6;
  AutoInitLibraryCodeScope::~AutoInitLibraryCodeScope((AutoInitLibraryCodeScope *)(args + 1));
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::InjectJsBuiltInLibraryCode(ScriptContext * scriptContext, JsBuiltInFile file)
    {
        JavascriptExceptionObject *pExceptionObject = nullptr;
        FunctionBody* jsBuiltInByteCode = nullptr;

        switch (file)
        {
            #define jsBuiltInByteCodeCase(class, type, obj) \
            case (JsBuiltInFile::class##_##type): \
            { \
                if (jsBuiltIn##class##_##type##Bytecode != nullptr) \
                    return; \
                EnsureSourceInfo(); \
                uint32 flags = fscrJsBuiltIn | (CONFIG_FLAG(CreateFunctionProxy) && !scriptContext->IsProfiling() ? fscrAllowFunctionProxy : 0); \
                SRCINFO* hsi = sourceInfo; \
                Js::ByteCodeSerializer::DeserializeFromBuffer(scriptContext, flags, (LPCUTF8)nullptr, hsi, (byte*)js::Library_Bytecode_##class##_##type, nullptr, &jsBuiltIn##class##_##type##Bytecode); \
                jsBuiltInByteCode = jsBuiltIn##class##_##type##Bytecode; \
                break; \
            }
            JsBuiltIns(jsBuiltInByteCodeCase)
            #undef jsBuiltInByteCodeCase
        }
        this->SetHasBytecode();

        try {
            AssertOrFailFast(jsBuiltInByteCode != nullptr);

            Js::ScriptFunction *functionGlobal = scriptContext->GetLibrary()->CreateScriptFunction(jsBuiltInByteCode);

            // If we are in the debugger and doing a GetProperty of arguments, then Js Builtins code will be injected on-demand
            // Since it is a cross site call, we marshall not only functionGlobal but also its entire prototype chain
            // The prototype of functionGlobal will be shared by a normal Js function,
            // so marshalling will inadvertently transition the entrypoint of the prototype to a crosssite entrypoint
            // So we set the prototype to null here
            functionGlobal->SetPrototype(scriptContext->GetLibrary()->nullValue);

#ifdef ENABLE_SCRIPT_PROFILING
            // If we are profiling, we need to register the script to the profiler callback, so the script compiled event will be sent.
            if (scriptContext->IsProfiling())
            {
                scriptContext->RegisterScript(functionGlobal->GetFunctionProxy());
            }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
            // Mark we are profiling library code already, so that any initialization library code called here won't be reported to profiler.
            // Also tell the debugger not to record events during intialization so that we don't leak information about initialization.
            AutoInitLibraryCodeScope autoInitLibraryCodeScope(scriptContext);
#endif

            Js::Var args[] = { scriptContext->GetLibrary()->GetUndefined(), scriptContext->GetLibrary()->GetEngineInterfaceObject() };
            Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args));

#if ENABLE_JS_REENTRANCY_CHECK
            // Create a Reentrancy lock to make sure we correctly restore the lock at the end of BuiltIns initialization
            JsReentLock lock(scriptContext->GetThreadContext());
            // Clear ReentrancyLock bit as initialization code doesn't have any side effect
            scriptContext->GetThreadContext()->SetNoJsReentrancy(false);
#endif
            // specify which set of BuiltIns are currently being loaded
            current = file;

            // Clear disable implicit call bit as initialization code doesn't have any side effect
            {
                ThreadContext::AutoRestoreImplicitFlags autoRestoreImplicitFlags(scriptContext->GetThreadContext(), scriptContext->GetThreadContext()->GetImplicitCallFlags(), scriptContext->GetThreadContext()->GetDisableImplicitFlags());
                scriptContext->GetThreadContext()->ClearDisableImplicitFlags();
                JavascriptFunction::CallRootFunctionInScript(functionGlobal, Js::Arguments(callInfo, args));

                Js::ScriptFunction *functionBuiltins = scriptContext->GetLibrary()->CreateScriptFunction(jsBuiltInByteCode->GetNestedFunctionForExecution(0));
                functionBuiltins->SetPrototype(scriptContext->GetLibrary()->nullValue);
                JavascriptFunction::CallRootFunctionInScript(functionBuiltins, Js::Arguments(callInfo, args));
            }

            if (file == JsBuiltInFile::Array_prototype)
            {
                InitializePrototypes(scriptContext);
            }
#if DBG_DUMP
            if (PHASE_DUMP(Js::ByteCodePhase, functionGlobal->GetFunctionProxy()) && Js::Configuration::Global.flags.Verbose)
            {
                DumpByteCode();
            }
#endif
        }
        catch (const JavascriptException& err)
        {
            pExceptionObject = err.GetAndClear();
        }

        if (pExceptionObject)
        {
            switch (file)
            {
                #define clearJsBuiltInByteCodeCase(class, type, obj) \
            case (JsBuiltInFile::class##_##type): \
                jsBuiltIn##class##_##type##Bytecode = nullptr;
                    break;
            JsBuiltIns(clearJsBuiltInByteCodeCase)
            #undef clearJsBuiltInByteCodeCase
            }
            jsBuiltInByteCode = nullptr;
            if (pExceptionObject == ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
            {
                JavascriptExceptionOperators::DoThrowCheckClone(pExceptionObject, scriptContext);
            }
            Js::Throw::FatalJsBuiltInError();
        }
    }